

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O3

void __thiscall deqp::egl::Image::CreateImageGLES2::~CreateImageGLES2(CreateImageGLES2 *this)

{
  ImageSource *pIVar1;
  
  (this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CreateImageGLES2_02114170;
  pIVar1 = (this->m_source).
           super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           .m_data.ptr;
  if (pIVar1 != (ImageSource *)0x0) {
    (*pIVar1->_vptr_ImageSource[1])();
    (this->m_source).
    super_UniqueBase<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
    .m_data.ptr = (ImageSource *)0x0;
  }
  glu::CallLogWrapper::~CallLogWrapper(&(this->super_ImageTestCase).super_CallLogWrapper);
  TestCase::~TestCase((TestCase *)this);
  operator_delete(this,0x1ae0);
  return;
}

Assistant:

static const char* getTargetName (EGLint target)
	{
		switch (target)
		{
			case EGL_GL_TEXTURE_2D_KHR:						return "tex2d";
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_X_KHR:	return "cubemap_pos_x";
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_X_KHR:	return "cubemap_neg_x";
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Y_KHR:	return "cubemap_pos_y";
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Y_KHR:	return "cubemap_neg_y";
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Z_KHR:	return "cubemap_pos_z";
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Z_KHR:	return "cubemap_neg_z";
			case EGL_GL_RENDERBUFFER_KHR:					return "renderbuffer";
			case EGL_NATIVE_BUFFER_ANDROID:					return "android_native";
			default:		DE_ASSERT(DE_FALSE);			return "";
		}
	}